

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enummanager.cpp
# Opt level: O2

Enum * __thiscall camp::detail::EnumManager::getById(EnumManager *this,string *id)

{
  iterator iVar1;
  EnumNotFound *__return_storage_ptr__;
  allocator local_a2;
  allocator local_a1;
  string local_a0;
  string local_80;
  EnumNotFound local_60;
  
  iVar1 = boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::id>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<1,camp::detail::EnumManager::EnumInfo,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Id,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::id>,mpl_::na>,boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Name,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::name>,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<camp::detail::EnumManager::EnumInfo>>,boost::mpl::v_item<camp::detail::EnumManager::Id,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
          ::find<std::__cxx11::string>
                    ((ordered_index_impl<boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::id>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<1,camp::detail::EnumManager::EnumInfo,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Id,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::id>,mpl_::na>,boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Name,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::name>,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<camp::detail::EnumManager::EnumInfo>>,boost::mpl::v_item<camp::detail::EnumManager::Id,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
                      *)&(this->m_enums).super_type,id);
  if (iVar1.node !=
      (this->m_enums).
      super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::EnumManager::EnumInfo,_std::allocator<camp::detail::EnumManager::EnumInfo>_>_>_>_*,_boost::multi_index::multi_index_container<camp::detail::EnumManager::EnumInfo,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::id>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::detail::EnumManager::EnumInfo>_>_>
      .member) {
    return *(Enum **)((long)&((iVar1.node)->
                             super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::EnumManager::EnumInfo,_std::allocator<camp::detail::EnumManager::EnumInfo>_>_>
                             ).
                             super_index_node_base<camp::detail::EnumManager::EnumInfo,_std::allocator<camp::detail::EnumManager::EnumInfo>_>
                             .super_pod_value_holder<camp::detail::EnumManager::EnumInfo>.space.
                             data_ + 0x40);
  }
  __return_storage_ptr__ = (EnumNotFound *)__cxa_allocate_exception(0x48);
  EnumNotFound::EnumNotFound(&local_60,id);
  std::__cxx11::string::string
            ((string *)&local_80,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/enummanager.cpp"
             ,&local_a1);
  std::__cxx11::string::string
            ((string *)&local_a0,
             "const Enum &camp::detail::EnumManager::getById(const std::string &) const",&local_a2);
  Error::prepare<camp::EnumNotFound>(__return_storage_ptr__,&local_60,&local_80,0x70,&local_a0);
  __cxa_throw(__return_storage_ptr__,&EnumNotFound::typeinfo,Error::~Error);
}

Assistant:

const Enum& EnumManager::getById(const std::string& id) const
{
    const IdIndex& ids = m_enums.get<Id>();

    IdIndex::const_iterator it = ids.find(id);
    if (it == ids.end())
        CAMP_ERROR(EnumNotFound(id));

    return *it->enumPtr;
}